

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2text.c
# Opt level: O0

int print_labeled_buf(BIO *out,char *label,uchar *buf,size_t buflen)

{
  int iVar1;
  ulong in_RCX;
  char *pcVar2;
  long in_RDX;
  undefined8 in_RSI;
  BIO *in_RDI;
  size_t i;
  ulong local_30;
  int local_4;
  
  iVar1 = BIO_printf(in_RDI,"%s\n",in_RSI);
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (local_30 % 0xf == 0) {
        if ((local_30 != 0) && (iVar1 = BIO_printf(in_RDI,"\n"), iVar1 < 1)) {
          return 0;
        }
        iVar1 = BIO_printf(in_RDI,"    ");
        if (iVar1 < 1) {
          return 0;
        }
      }
      pcVar2 = ":";
      if (local_30 == in_RCX - 1) {
        pcVar2 = "";
      }
      iVar1 = BIO_printf(in_RDI,"%02x%s",(ulong)*(byte *)(in_RDX + local_30),pcVar2);
      if (iVar1 < 1) {
        return 0;
      }
    }
    iVar1 = BIO_printf(in_RDI,"\n");
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int print_labeled_buf(BIO *out, const char *label,
                             const unsigned char *buf, size_t buflen)
{
    size_t i;

    if (BIO_printf(out, "%s\n", label) <= 0)
        return 0;

    for (i = 0; i < buflen; i++) {
        if ((i % LABELED_BUF_PRINT_WIDTH) == 0) {
            if (i > 0 && BIO_printf(out, "\n") <= 0)
                return 0;
            if (BIO_printf(out, "    ") <= 0)
                return 0;
        }

        if (BIO_printf(out, "%02x%s", buf[i],
                                 (i == buflen - 1) ? "" : ":") <= 0)
            return 0;
    }
    if (BIO_printf(out, "\n") <= 0)
        return 0;

    return 1;
}